

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddUtil.c
# Opt level: O1

int Cudd_VectorSupportSize(DdManager *dd,DdNode **F,int n)

{
  int *support;
  int iVar1;
  ulong uVar2;
  uint uVar3;
  
  uVar3 = dd->size;
  if (dd->size < dd->sizeZ) {
    uVar3 = dd->sizeZ;
  }
  support = (int *)malloc((long)(int)uVar3 << 2);
  if (support == (int *)0x0) {
    dd->errorCode = CUDD_MEMORY_OUT;
    iVar1 = -1;
  }
  else {
    if (0 < (int)uVar3) {
      memset(support,0,(ulong)uVar3 * 4);
    }
    if (0 < n) {
      uVar2 = 0;
      do {
        ddSupportStep((DdNode *)((ulong)F[uVar2] & 0xfffffffffffffffe),support);
        uVar2 = uVar2 + 1;
      } while ((uint)n != uVar2);
    }
    if (0 < n) {
      uVar2 = 0;
      do {
        ddClearFlag((DdNode *)((ulong)F[uVar2] & 0xfffffffffffffffe));
        uVar2 = uVar2 + 1;
      } while ((uint)n != uVar2);
    }
    if ((int)uVar3 < 1) {
      iVar1 = 0;
    }
    else {
      uVar2 = 0;
      iVar1 = 0;
      do {
        iVar1 = iVar1 + (uint)(support[uVar2] == 1);
        uVar2 = uVar2 + 1;
      } while (uVar3 != uVar2);
    }
    free(support);
  }
  return iVar1;
}

Assistant:

int
Cudd_VectorSupportSize(
  DdManager * dd /* manager */,
  DdNode ** F /* array of DDs whose support is sought */,
  int  n /* size of the array */)
{
    int *support;
    int i;
    int size;
    int count;

    /* Allocate and initialize support array for ddSupportStep. */
    size = ddMax(dd->size, dd->sizeZ);
    support = ABC_ALLOC(int,size);
    if (support == NULL) {
        dd->errorCode = CUDD_MEMORY_OUT;
        return(CUDD_OUT_OF_MEM);
    }
    for (i = 0; i < size; i++) {
        support[i] = 0;
    }

    /* Compute support and clean up markers. */
    for (i = 0; i < n; i++) {
        ddSupportStep(Cudd_Regular(F[i]),support);
    }
    for (i = 0; i < n; i++) {
        ddClearFlag(Cudd_Regular(F[i]));
    }

    /* Count vriables in support. */
    count = 0;
    for (i = 0; i < size; i++) {
        if (support[i] == 1) count++;
    }

    ABC_FREE(support);
    return(count);

}